

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O2

VRle __thiscall VRle::operator&(VRle *this,VRle *o)

{
  model *pmVar1;
  Data *pDVar2;
  Span *__n;
  long *in_RDX;
  int __fd;
  View a;
  View b;
  undefined1 auVar4 [16];
  pointer pSVar3;
  
  pmVar1 = (o->d).mModel;
  if (((pmVar1->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (pmVar1->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
       super__Vector_impl_data._M_finish) || (*(long *)(*in_RDX + 8) == *(long *)(*in_RDX + 0x10)))
  {
    (this->d).mModel = (model *)0x0;
    vcow_ptr<VRle::Data>::vcow_ptr(&this->d);
  }
  else {
    pDVar2 = (Data *)_ZTWL14Scratch_Object();
    Data::reset(pDVar2);
    pDVar2 = (Data *)_ZTWL14Scratch_Object();
    pmVar1 = (o->d).mModel;
    pSVar3 = (pmVar1->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
             _M_impl.super__Vector_impl_data._M_start;
    a._size = (long)(pmVar1->mValue).mSpans.
                    super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pSVar3 >> 3;
    __n = *(Span **)(*in_RDX + 8);
    b._size = *(long *)(*in_RDX + 0x10) - (long)__n >> 3;
    a._data = pSVar3;
    b._data = __n;
    Data::opIntersect(pDVar2,a,b);
    __fd = (int)pSVar3;
    vcow_ptr<VRle::Data>::vcow_ptr(&this->d);
    auVar4 = _ZTWL14Scratch_Object();
    pDVar2 = (Data *)vcow_ptr<VRle::Data>::write(&this->d,__fd,auVar4._8_8_,(size_t)__n);
    Data::operator=(pDVar2,auVar4._0_8_);
  }
  return (VRle)(vcow_ptr<VRle::Data>)this;
}

Assistant:

VRle VRle::operator&(const VRle &o) const
{
    if (empty() || o.empty()) return {};

    Scratch_Object.reset();
    Scratch_Object.opIntersect(d.read().view(), o.d.read().view());

    VRle result;
    result.d.write() = Scratch_Object;

    return result;
}